

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

void mocker::ir::verifyFuncModule(FunctionModule *func)

{
  bool bVar1;
  BasicBlockList *pBVar2;
  reference this;
  element_type *peVar3;
  string *psVar4;
  size_t bb_00;
  iterator iVar5;
  iterator iVar6;
  InstList *pIVar7;
  reference psVar8;
  element_type *this_00;
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  *this_01;
  element_type *this_02;
  size_t local_220;
  reference local_218;
  pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *option;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  *__range4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sources;
  shared_ptr<mocker::ir::Phi> phi;
  shared_ptr<mocker::ir::IRInst> *inst_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  InstList *__range3_1;
  undefined1 local_1a0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> preds;
  BasicBlock *bb_3;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  BasicBlockList *__range2_3;
  shared_ptr<mocker::ir::Terminator> local_158;
  shared_ptr<mocker::ir::Phi> local_148;
  _List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_> local_138;
  const_iterator iter;
  BasicBlock *bb_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  BasicBlockList *__range2_2;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_100;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_f8;
  shared_ptr<mocker::ir::Addr> local_f0;
  undefined1 local_e0 [8];
  shared_ptr<mocker::ir::Reg> reg;
  undefined1 local_c8 [8];
  shared_ptr<mocker::ir::Reg> dest;
  shared_ptr<mocker::ir::IRInst> *inst;
  const_iterator __end3;
  const_iterator __begin3;
  InstList *__range3;
  BasicBlock *bb_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  BasicBlockList *__range2_1;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defined;
  BasicBlock *bb;
  const_iterator __end2;
  const_iterator __begin2;
  BasicBlockList *__range2;
  FunctionModule *func_local;
  
  pBVar2 = FunctionModule::getBBs_abi_cxx11_(func);
  __end2 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
           begin(pBVar2);
  bb = (BasicBlock *)
       std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::end
                 (pBVar2);
  while (bVar1 = std::operator!=(&__end2,(_Self *)&bb), bVar1) {
    defined._M_h._M_single_bucket =
         (__node_base_ptr)std::_List_const_iterator<mocker::ir::BasicBlock>::operator*(&__end2);
    bVar1 = BasicBlock::isCompleted((BasicBlock *)defined._M_h._M_single_bucket);
    if (!bVar1) {
      __assert_fail("false && \"block not being terminated\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                    ,0xfa,"void mocker::ir::verifyFuncModule(const ir::FunctionModule &)");
    }
    std::_List_const_iterator<mocker::ir::BasicBlock>::operator++(&__end2);
  }
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range2_1);
  pBVar2 = FunctionModule::getBBs_abi_cxx11_(func);
  __end2_1 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
             begin(pBVar2);
  bb_1 = (BasicBlock *)
         std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::end
                   (pBVar2);
  while (bVar1 = std::operator!=(&__end2_1,(_Self *)&bb_1), bVar1) {
    this = std::_List_const_iterator<mocker::ir::BasicBlock>::operator*(&__end2_1);
    pIVar7 = BasicBlock::getInsts_abi_cxx11_(this);
    __end3 = std::__cxx11::
             list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
             ::begin(pIVar7);
    inst = (shared_ptr<mocker::ir::IRInst> *)
           std::__cxx11::
           list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
           ::end(pIVar7);
    while (bVar1 = std::operator!=(&__end3,(_Self *)&inst), bVar1) {
      dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*(&__end3);
      getDest((ir *)local_c8,
              (shared_ptr<mocker::ir::IRInst> *)
              dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             );
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_c8);
      if (bVar1) {
        std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                  (&local_f0,(shared_ptr<mocker::ir::Reg> *)local_c8);
        dycLocalReg((ir *)local_e0,&local_f0);
        std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_f0);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_e0);
        if (!bVar1) {
          __assert_fail("reg",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                        ,0x104,"void mocker::ir::verifyFuncModule(const ir::FunctionModule &)");
        }
        peVar3 = std::__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_e0);
        psVar4 = Reg::getIdentifier_abi_cxx11_(peVar3);
        local_f8._M_cur =
             (__node_type *)
             std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range2_1,psVar4);
        local_100._M_cur =
             (__node_type *)
             std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range2_1);
        bVar1 = std::__detail::operator!=(&local_f8,&local_100);
        if (bVar1) {
          __assert_fail("false && \"register with multiple definitions\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                        ,0x106,"void mocker::ir::verifyFuncModule(const ir::FunctionModule &)");
        }
        peVar3 = std::__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_e0);
        psVar4 = Reg::getIdentifier_abi_cxx11_(peVar3);
        std::
        unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::emplace<std::__cxx11::string_const&>
                  ((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&__range2_1,psVar4);
        std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_e0);
        reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
             = 0;
      }
      else {
        reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
             = 7;
      }
      std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_c8);
      std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++(&__end3);
    }
    std::_List_const_iterator<mocker::ir::BasicBlock>::operator++(&__end2_1);
  }
  pBVar2 = FunctionModule::getBBs_abi_cxx11_(func);
  __end2_2 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
             begin(pBVar2);
  bb_2 = (BasicBlock *)
         std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::end
                   (pBVar2);
  while (bVar1 = std::operator!=(&__end2_2,(_Self *)&bb_2), bVar1) {
    iter._M_node = (_List_node_base *)
                   std::_List_const_iterator<mocker::ir::BasicBlock>::operator*(&__end2_2);
    pIVar7 = BasicBlock::getInsts_abi_cxx11_((BasicBlock *)iter._M_node);
    local_138._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
         ::begin(pIVar7);
    while( true ) {
      psVar8 = std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*
                         (&local_138);
      dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)&local_148,psVar8);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_148);
      std::shared_ptr<mocker::ir::Phi>::~shared_ptr(&local_148);
      if (!bVar1) break;
      std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++(&local_138);
    }
    psVar8 = std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*(&local_138);
    dyc<mocker::ir::Terminator,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)&local_158,psVar8);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_158);
    std::shared_ptr<mocker::ir::Terminator>::~shared_ptr(&local_158);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      psVar8 = std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*
                         (&local_138);
      dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)&__range2_3,psVar8);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&__range2_3);
      std::shared_ptr<mocker::ir::Phi>::~shared_ptr((shared_ptr<mocker::ir::Phi> *)&__range2_3);
      if (bVar1) {
        __assert_fail("false && \"misplaced phi-function\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                      ,0x112,"void mocker::ir::verifyFuncModule(const ir::FunctionModule &)");
      }
      std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++(&local_138);
    }
    std::_List_const_iterator<mocker::ir::BasicBlock>::operator++(&__end2_2);
  }
  pBVar2 = FunctionModule::getBBs_abi_cxx11_(func);
  __end2_3 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
             begin(pBVar2);
  bb_3 = (BasicBlock *)
         std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::end
                   (pBVar2);
  do {
    bVar1 = std::operator!=(&__end2_3,(_Self *)&bb_3);
    if (!bVar1) {
      std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2_1);
      return;
    }
    preds.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         &std::_List_const_iterator<mocker::ir::BasicBlock>::operator*(&__end2_3)->labelID;
    bb_00 = BasicBlock::getLabelID
                      ((BasicBlock *)
                       preds.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    FunctionModule::getPredcessors
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1a0,func,bb_00);
    iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1a0);
    iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1a0);
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )iVar5._M_current,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )iVar6._M_current);
    pIVar7 = BasicBlock::getInsts_abi_cxx11_
                       ((BasicBlock *)
                        preds.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    __end3_1 = std::__cxx11::
               list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
               ::begin(pIVar7);
    inst_1 = (shared_ptr<mocker::ir::IRInst> *)
             std::__cxx11::
             list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
             ::end(pIVar7);
    while (bVar1 = std::operator!=(&__end3_1,(_Self *)&inst_1), bVar1) {
      psVar8 = std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*(&__end3_1)
      ;
      dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>const&>
                ((ir *)&sources.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,psVar8);
      bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)
                         &sources.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range4);
        this_00 = std::
                  __shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&sources.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
        this_01 = Phi::getOptions(this_00);
        __end4 = std::
                 vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                 ::begin(this_01);
        option = (pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *)
                 std::
                 vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                 ::end(this_01);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<const_std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_*,_std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>_>
                                           *)&option), bVar1) {
          local_218 = __gnu_cxx::
                      __normal_iterator<const_std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_*,_std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>_>
                      ::operator*(&__end4);
          this_02 = std::
                    __shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&local_218->second);
          local_220 = Label::getID(this_02);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range4,&local_220);
          __gnu_cxx::
          __normal_iterator<const_std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_*,_std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>_>
          ::operator++(&__end4);
        }
        iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range4);
        iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range4);
        std::
        sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )iVar5._M_current,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )iVar6._M_current);
        bVar1 = std::operator!=((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1a0,
                                (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range4);
        if (bVar1) {
          __assert_fail("false && \"mismatched predecessors and phi-function options\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                        ,0x126,"void mocker::ir::verifyFuncModule(const ir::FunctionModule &)");
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range4);
        reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
             = 0;
      }
      else {
        reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
             = 0xe;
      }
      std::shared_ptr<mocker::ir::Phi>::~shared_ptr
                ((shared_ptr<mocker::ir::Phi> *)
                 &sources.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      if (reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ != 0) break;
      std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++(&__end3_1);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1a0);
    std::_List_const_iterator<mocker::ir::BasicBlock>::operator++(&__end2_3);
  } while( true );
}

Assistant:

void verifyFuncModule(const ir::FunctionModule &func) {
  // check whether all blocks are terminated
  for (const auto &bb : func.getBBs())
    if (!bb.isCompleted())
      assert(false && "block not being terminated");

  // check whether all register are only defined once
  std::unordered_set<std::string> defined;
  for (auto &bb : func.getBBs()) {
    for (auto &inst : bb.getInsts()) {
      auto dest = getDest(inst);
      if (!dest)
        continue;
      auto reg = dycLocalReg(dest);
      assert(reg);
      if (defined.find(reg->getIdentifier()) != defined.end())
        assert(false && "register with multiple definitions");
      defined.emplace(reg->getIdentifier());
    }
  }

  // check whether there exists phi-functions that are in the middle of a block
  for (const auto &bb : func.getBBs()) {
    auto iter = bb.getInsts().begin();
    while (ir::dyc<ir::Phi>(*iter))
      ++iter;
    if (!ir::dyc<ir::Terminator>(*iter)) {
      if (ir::dyc<ir::Phi>(*iter))
        assert(false && "misplaced phi-function");
      ++iter;
    }
  }

  // check the validation of phi-functions
  for (const auto &bb : func.getBBs()) {
    auto preds = func.getPredcessors(bb.getLabelID());
    std::sort(preds.begin(), preds.end());

    for (auto &inst : bb.getInsts()) {
      auto phi = dyc<ir::Phi>(inst);
      if (!phi)
        break;

      std::vector<std::size_t> sources;
      for (auto &option : phi->getOptions())
        sources.emplace_back(option.second->getID());
      std::sort(sources.begin(), sources.end());
      if (preds != sources)
        assert(false && "mismatched predecessors and phi-function options");
    }
  }
}